

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_ppm.cpp
# Opt level: O3

void PPM::PredictVelOnFaces
               (Box *bx,Array4<double> *Imx,Array4<double> *Imy,Array4<double> *Imz,
               Array4<double> *Ipx,Array4<double> *Ipy,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *vel,Geometry geom,Real dt,BCRec *pbc)

{
  BCRec *pBVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  long lVar68;
  long lVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double *local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  double *local_478;
  double *local_470;
  long local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  double *local_3e8;
  
  iVar4 = (bx->smallend).vect[0];
  lVar73 = (long)iVar4;
  uVar5 = (q->begin).x;
  lVar76 = (long)(int)uVar5;
  iVar60 = geom.domain.bigend.vect[0] - uVar5;
  uVar6 = (q->begin).y;
  iVar61 = geom.domain.bigend.vect[1] - uVar6;
  uVar7 = (q->begin).z;
  iVar62 = geom.domain.bigend.vect[2] - uVar7;
  iVar63 = iVar4 - uVar5;
  lVar27 = q->jstride;
  lVar28 = q->kstride;
  lVar29 = vel->nstride;
  lVar66 = (long)(vel->begin).x;
  pdVar30 = vel->p;
  lVar31 = vel->jstride;
  lVar32 = vel->kstride;
  iVar8 = (vel->begin).y;
  iVar9 = (vel->begin).z;
  pdVar33 = q->p;
  lVar34 = q->nstride;
  local_470 = Imx->p + (lVar73 - (Imx->begin).x);
  lVar35 = Imx->jstride;
  lVar36 = Imx->kstride;
  lVar37 = Imx->nstride;
  iVar10 = (Imx->begin).y;
  iVar11 = (Imx->begin).z;
  local_478 = Ipx->p + (lVar73 - (Ipx->begin).x);
  local_480 = Imy->p + (lVar73 - (Imy->begin).x);
  lVar38 = Ipx->jstride;
  lVar39 = Ipx->kstride;
  lVar40 = Ipx->nstride;
  iVar12 = (Ipx->begin).y;
  iVar13 = (Ipx->begin).z;
  lVar41 = Imy->jstride;
  lVar42 = Imy->kstride;
  lVar43 = Imy->nstride;
  iVar14 = (Imy->begin).y;
  iVar15 = (Imy->begin).z;
  local_488 = Ipy->p + (lVar73 - (Ipy->begin).x);
  lVar44 = Ipy->jstride;
  lVar45 = Ipy->kstride;
  lVar46 = Ipy->nstride;
  iVar16 = (Ipy->begin).y;
  iVar17 = (Ipy->begin).z;
  local_498 = Imz->p + (lVar73 - (Imz->begin).x);
  lVar47 = Imz->jstride;
  lVar48 = Imz->kstride;
  lVar49 = Imz->nstride;
  iVar18 = (Imz->begin).y;
  iVar19 = (Imz->begin).z;
  local_490 = Ipz->p + (lVar73 - (Ipz->begin).x);
  lVar50 = Ipz->jstride;
  lVar51 = Ipz->kstride;
  lVar52 = Ipz->nstride;
  iVar20 = (Ipz->begin).y;
  iVar21 = (Ipz->begin).z;
  iVar22 = (bx->smallend).vect[1];
  iVar23 = (bx->smallend).vect[2];
  iVar24 = (bx->bigend).vect[0];
  iVar25 = (bx->bigend).vect[1];
  iVar26 = (bx->bigend).vect[2];
  local_420 = pdVar33 + (((int)((geom.domain.smallend.vect[1] - uVar6) + 2) * lVar27 + lVar73) -
                        lVar76);
  local_428 = pdVar33 + (((int)(geom.domain.smallend.vect[1] - uVar6) * lVar27 + lVar73) - lVar76);
  local_430 = pdVar33 + (((int)(~uVar6 + geom.domain.smallend.vect[1]) * lVar27 + lVar73) - lVar76);
  local_438 = pdVar33 + (((iVar61 + -2) * lVar27 + lVar73) - lVar76);
  local_440 = pdVar33 + ((iVar61 * lVar27 + lVar73) - lVar76);
  local_448 = pdVar33 + (((iVar61 + 1) * lVar27 + lVar73) - lVar76);
  local_450 = pdVar33 + (lVar73 - lVar76);
  local_3e8 = pdVar33 + (((int)((geom.domain.smallend.vect[2] - uVar7) + 2) * lVar28 + lVar73) -
                        lVar76);
  local_3f0 = pdVar33 + (((int)(geom.domain.smallend.vect[2] - uVar7) * lVar28 + lVar73) - lVar76);
  local_3f8 = pdVar33 + (((int)(~uVar7 + geom.domain.smallend.vect[2]) * lVar28 + lVar73) - lVar76);
  local_400 = pdVar33 + (((iVar62 + -2) * lVar28 + lVar73) - lVar76);
  local_408 = pdVar33 + ((iVar62 * lVar28 + lVar73) - lVar76);
  local_410 = pdVar33 + (((iVar62 + 1) * lVar28 + lVar73) - lVar76);
  lVar76 = lVar28 * 8;
  lVar2 = lVar27 * 8;
  local_458 = 0;
  do {
    if (iVar23 <= iVar26) {
      pBVar1 = pbc + local_458;
      lVar72 = local_458 * lVar34;
      iVar61 = iVar23;
      do {
        if (iVar22 <= iVar25) {
          lVar75 = (long)(iVar61 - iVar9) * lVar32 * 8;
          iVar62 = iVar61 - uVar7;
          lVar64 = lVar28 * iVar62;
          lVar74 = iVar62 * lVar76;
          lVar71 = (long)iVar22;
          do {
            iVar70 = (int)lVar71;
            if (iVar4 <= iVar24) {
              lVar69 = (lVar71 - iVar8) * lVar31 * 8;
              lVar65 = (lVar71 - (int)uVar6) * lVar27;
              lVar55 = (lVar71 - iVar12) * lVar38 * 8 + (long)(iVar61 - iVar13) * lVar39 * 8;
              lVar54 = (lVar71 - iVar10) * lVar35 * 8 + (long)(iVar61 - iVar11) * lVar36 * 8;
              lVar57 = (lVar71 - iVar16) * lVar44 * 8 + (long)(iVar61 - iVar17) * lVar45 * 8;
              lVar56 = (lVar71 - iVar14) * lVar41 * 8 + (long)(iVar61 - iVar15) * lVar42 * 8;
              lVar58 = (lVar71 - iVar20) * lVar50 * 8 + (long)(iVar61 - iVar21) * lVar51 * 8;
              lVar77 = (lVar71 - (int)uVar6) * lVar2;
              lVar59 = lVar77 + lVar74;
              lVar68 = 0;
              do {
                iVar67 = (int)lVar68;
                dVar86 = pdVar33[lVar65 + lVar64 + lVar72 + (iVar63 + -1 + iVar67)];
                dVar3 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                dVar87 = pdVar33[lVar65 + lVar64 + lVar72 + (iVar63 + 1 + iVar67)];
                dVar89 = (dVar87 - dVar3) + (dVar87 - dVar3);
                dVar90 = (dVar3 - dVar86) + (dVar3 - dVar86);
                dVar96 = 0.0;
                dVar83 = ABS(dVar89);
                dVar84 = ABS(dVar90);
                dVar97 = 0.0;
                uVar53 = (ulong)DAT_00753000;
                if (1.0000000000000001e-20 < dVar90 * dVar89) {
                  dVar93 = (dVar87 - dVar86) * 0.5;
                  dVar85 = ABS(dVar93);
                  dVar97 = dVar83;
                  if (dVar84 <= dVar83) {
                    dVar97 = dVar84;
                  }
                  if (dVar85 <= dVar97) {
                    dVar97 = dVar85;
                  }
                  dVar97 = dVar97 * (double)((ulong)dVar93 & 0x8000000000000000 | uVar53);
                }
                dVar93 = pdVar33[lVar65 + lVar64 + lVar72 + (iVar63 + -2 + iVar67)];
                dVar85 = (dVar86 - dVar93) + (dVar86 - dVar93);
                if (1.0000000000000001e-20 < dVar85 * dVar90) {
                  dVar91 = (dVar3 - dVar93) * 0.5;
                  dVar92 = ABS(dVar91);
                  dVar85 = ABS(dVar85);
                  dVar96 = ABS(dVar90);
                  if (dVar85 <= ABS(dVar90)) {
                    dVar96 = dVar85;
                  }
                  if (dVar92 <= dVar96) {
                    dVar96 = dVar92;
                  }
                  dVar96 = dVar96 * (double)((ulong)dVar91 & 0x8000000000000000 | uVar53);
                }
                dVar85 = pdVar33[lVar65 + lVar64 + lVar72 + (iVar63 + iVar67 + 2)];
                dVar91 = (dVar85 - dVar87) + (dVar85 - dVar87);
                dVar92 = 0.0;
                dVar94 = 0.0;
                if (1.0000000000000001e-20 < dVar89 * dVar91) {
                  dVar94 = (dVar85 - dVar3) * 0.5;
                  dVar95 = ABS(dVar94);
                  dVar91 = ABS(dVar91);
                  if (ABS(dVar89) <= dVar91) {
                    dVar91 = ABS(dVar89);
                  }
                  if (dVar95 <= dVar91) {
                    dVar91 = dVar95;
                  }
                  dVar94 = dVar91 * (double)((ulong)dVar94 & 0x8000000000000000 | uVar53);
                }
                if (1.0000000000000001e-20 < dVar90 * dVar89) {
                  dVar89 = (dVar87 - dVar86) * 0.5;
                  dVar90 = ABS(dVar89);
                  if (dVar84 <= dVar83) {
                    dVar83 = dVar84;
                  }
                  if (dVar90 <= dVar83) {
                    dVar83 = dVar90;
                  }
                  dVar92 = dVar83 * (double)((ulong)dVar89 & 0x8000000000000000 | uVar53);
                }
                dVar97 = (dVar86 + dVar3) * 0.5 + (dVar97 - dVar96) * -0.16666666666666666;
                dVar83 = dVar86;
                if (dVar3 <= dVar86) {
                  dVar83 = dVar3;
                }
                if (dVar83 <= dVar97) {
                  dVar83 = dVar97;
                }
                dVar97 = dVar86;
                if (dVar86 <= dVar3) {
                  dVar97 = dVar3;
                }
                if (dVar83 <= dVar97) {
                  dVar97 = dVar83;
                }
                dVar96 = (dVar3 + dVar87) * 0.5 + (dVar94 - dVar92) * -0.16666666666666666;
                dVar83 = dVar87;
                if (dVar3 <= dVar87) {
                  dVar83 = dVar3;
                }
                if (dVar83 <= dVar96) {
                  dVar83 = dVar96;
                }
                dVar96 = dVar87;
                if (dVar87 <= dVar3) {
                  dVar96 = dVar3;
                }
                if (dVar83 <= dVar96) {
                  dVar96 = dVar83;
                }
                dVar89 = dVar96 - dVar3;
                dVar83 = dVar3;
                dVar84 = dVar3;
                if (0.0 <= (dVar3 - dVar97) * dVar89) {
                  dVar90 = ABS(dVar89);
                  dVar91 = ABS(dVar97 - dVar3);
                  dVar83 = dVar97;
                  if (dVar91 + dVar91 <= dVar90) {
                    dVar84 = dVar3 * 3.0 - (dVar97 + dVar97);
                  }
                  else {
                    dVar84 = dVar96;
                    if (dVar90 + dVar90 <= dVar91) {
                      dVar83 = dVar3 * 3.0 - (dVar96 + dVar96);
                    }
                  }
                }
                dVar90 = *(double *)
                          ((long)pdVar30 + lVar68 * 8 + lVar69 + lVar75 + lVar73 * 8 + lVar66 * -8);
                if (pBVar1->bc[0] - 3U < 2) {
                  if (geom.domain.smallend.vect[0] - lVar73 == lVar68) {
                    dVar83 = dVar85 * -0.05 + dVar87 * 0.5 + dVar86 * -0.2 + dVar3 * 0.75;
                    dVar96 = dVar3;
                    if (dVar87 <= dVar3) {
                      dVar96 = dVar87;
                    }
                    if (dVar96 <= dVar83) {
                      dVar96 = dVar83;
                    }
                    dVar84 = dVar3;
                    if (dVar3 <= dVar87) {
                      dVar84 = dVar87;
                    }
                    dVar83 = dVar86;
                    if (dVar96 <= dVar84) {
                      dVar84 = dVar96;
                    }
                  }
                  else if ((geom.domain.smallend.vect[0] + 1) - lVar73 == lVar68) {
                    dVar97 = pdVar33[lVar65 + lVar64 + (int)(geom.domain.smallend.vect[0] - uVar5) +
                                                       lVar72];
                    dVar84 = pdVar33[lVar65 + lVar64 + (int)((geom.domain.smallend.vect[0] - uVar5)
                                                            + 2) + lVar72] * -0.05 +
                             dVar3 * 0.5 +
                             pdVar33[lVar65 + lVar64 + (int)(~uVar5 + geom.domain.smallend.vect[0])
                                                       + lVar72] * -0.2 + dVar97 * 0.75;
                    dVar83 = dVar97;
                    if (dVar3 <= dVar97) {
                      dVar83 = dVar3;
                    }
                    if (dVar83 <= dVar84) {
                      dVar83 = dVar84;
                    }
                    if (dVar97 <= dVar3) {
                      dVar97 = dVar3;
                    }
                    if (dVar83 <= dVar97) {
                      dVar97 = dVar83;
                    }
                    dVar83 = dVar3;
                    dVar84 = dVar3;
                    if (0.0 < (dVar3 - dVar97) * dVar89) {
                      dVar89 = ABS(dVar89);
                      dVar85 = ABS(dVar97 - dVar3);
                      dVar83 = dVar97;
                      if (dVar85 + dVar85 <= dVar89) {
                        dVar84 = dVar3 * 3.0 - (dVar97 + dVar97);
                      }
                      else {
                        dVar84 = dVar96;
                        if (dVar89 + dVar89 <= dVar85) {
                          dVar83 = dVar3 * 3.0 - (dVar96 + dVar96);
                        }
                      }
                    }
                  }
                }
                if (pBVar1->bc[3] - 3U < 2) {
                  if (geom.domain.bigend.vect[0] - lVar73 == lVar68) {
                    dVar83 = dVar93 * -0.05 + dVar86 * 0.5 + dVar87 * -0.2 + dVar3 * 0.75;
                    dVar97 = dVar3;
                    if (dVar86 <= dVar3) {
                      dVar97 = dVar86;
                    }
                    if (dVar97 <= dVar83) {
                      dVar97 = dVar83;
                    }
                    dVar83 = dVar3;
                    if (dVar3 <= dVar86) {
                      dVar83 = dVar86;
                    }
                    dVar84 = dVar87;
                    if (dVar97 <= dVar83) {
                      dVar83 = dVar97;
                    }
                  }
                  else if ((geom.domain.bigend.vect[0] + -1) - lVar73 == lVar68) {
                    dVar86 = pdVar33[lVar65 + lVar64 + iVar60 + lVar72];
                    uVar78 = SUB84(dVar86,0);
                    uVar79 = (undefined4)((ulong)dVar86 >> 0x20);
                    dVar83 = pdVar33[lVar65 + lVar64 + (iVar60 + -2) + lVar72] * -0.05 +
                             dVar3 * 0.5 +
                             pdVar33[lVar65 + lVar64 + (iVar60 + 1) + lVar72] * -0.2 + dVar86 * 0.75
                    ;
                    dVar87 = dVar86;
                    if (dVar3 <= dVar86) {
                      dVar87 = dVar3;
                    }
                    if (dVar87 <= dVar83) {
                      dVar87 = dVar83;
                    }
                    if (dVar86 <= dVar3) {
                      uVar78 = SUB84(dVar3,0);
                      uVar79 = (undefined4)((ulong)dVar3 >> 0x20);
                    }
                    if (dVar87 <= (double)CONCAT44(uVar79,uVar78)) {
                      uVar78 = SUB84(dVar87,0);
                      uVar79 = (undefined4)((ulong)dVar87 >> 0x20);
                    }
                    dVar86 = (double)CONCAT44(uVar79,uVar78) - dVar3;
                    dVar83 = dVar3;
                    dVar84 = dVar3;
                    if (0.0 < (dVar3 - dVar97) * dVar86) {
                      dVar86 = ABS(dVar86);
                      dVar87 = ABS(dVar97 - dVar3);
                      if (dVar87 + dVar87 <= dVar86) {
                        dVar83 = dVar97;
                        dVar84 = dVar3 * 3.0 - (dVar97 + dVar97);
                      }
                      else {
                        if (dVar86 + dVar86 <= dVar87) {
                          dVar97 = dVar3 * 3.0 -
                                   ((double)CONCAT44(uVar79,uVar78) +
                                   (double)CONCAT44(uVar79,uVar78));
                        }
                        dVar83 = dVar97;
                        dVar84 = (double)CONCAT44(uVar79,uVar78);
                      }
                    }
                  }
                }
                dVar87 = dVar3 * 6.0 + (dVar83 + dVar84) * -3.0;
                dVar86 = ABS(dVar90) * (dt / geom.super_CoordSys.dx[0]);
                if (dVar90 <= 1e-08) {
                  *(double *)((long)local_478 + lVar68 * 8 + lVar55) = dVar3;
                  if (-1e-08 <= dVar90) goto LAB_0039fa3e;
                  *(double *)((long)local_470 + lVar68 * 8 + lVar54) =
                       ((dVar86 * -0.6666666666666666 + 1.0) * dVar87 + (dVar84 - dVar83)) *
                       dVar86 * 0.5 + dVar83;
                  dVar86 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                }
                else {
                  *(double *)((long)local_478 + lVar68 * 8 + lVar55) =
                       dVar86 * -0.5 *
                       ((dVar84 - dVar83) - (dVar86 * -0.6666666666666666 + 1.0) * dVar87) + dVar84;
LAB_0039fa3e:
                  dVar86 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                  *(double *)((long)local_470 + lVar68 * 8 + lVar54) = dVar86;
                }
                dVar3 = *(double *)
                         ((long)pdVar30 +
                         lVar68 * 8 + lVar69 + lVar75 + lVar73 * 8 + lVar29 * 8 + lVar66 * -8);
                dVar87 = *(double *)
                          ((long)local_450 +
                          lVar68 * 8 + (int)((iVar70 - uVar6) + -2) * lVar2 + lVar74);
                dVar83 = *(double *)
                          ((long)local_450 + lVar68 * 8 + (int)(~uVar6 + iVar70) * lVar2 + lVar74);
                dVar97 = *(double *)
                          ((long)local_450 +
                          lVar68 * 8 + (int)((iVar70 + 1) - uVar6) * lVar2 + lVar74);
                dVar96 = *(double *)
                          ((long)local_450 +
                          lVar68 * 8 + (int)((iVar70 - uVar6) + 2) * lVar2 + lVar74);
                dVar85 = (dVar97 - dVar86) + (dVar97 - dVar86);
                dVar91 = (dVar86 - dVar83) + (dVar86 - dVar83);
                dVar93 = 0.0;
                dVar84 = ABS(dVar85);
                dVar89 = ABS(dVar91);
                dVar90 = 0.0;
                uVar53 = (ulong)DAT_00753000;
                if (1.0000000000000001e-20 < dVar91 * dVar85) {
                  dVar92 = (dVar97 - dVar83) * 0.5;
                  dVar94 = ABS(dVar92);
                  dVar90 = dVar84;
                  if (dVar89 <= dVar84) {
                    dVar90 = dVar89;
                  }
                  if (dVar94 <= dVar90) {
                    dVar90 = dVar94;
                  }
                  dVar90 = dVar90 * (double)((ulong)dVar92 & 0x8000000000000000 | uVar53);
                }
                dVar92 = (dVar83 - dVar87) + (dVar83 - dVar87);
                if (1.0000000000000001e-20 < dVar92 * dVar91) {
                  dVar94 = (dVar86 - dVar87) * 0.5;
                  dVar95 = ABS(dVar94);
                  dVar92 = ABS(dVar92);
                  dVar93 = ABS(dVar91);
                  if (dVar92 <= ABS(dVar91)) {
                    dVar93 = dVar92;
                  }
                  if (dVar95 <= dVar93) {
                    dVar93 = dVar95;
                  }
                  dVar93 = dVar93 * (double)((ulong)dVar94 & 0x8000000000000000 | uVar53);
                }
                dVar94 = (dVar96 - dVar97) + (dVar96 - dVar97);
                dVar92 = 0.0;
                dVar95 = 0.0;
                if (1.0000000000000001e-20 < dVar85 * dVar94) {
                  dVar95 = (dVar96 - dVar86) * 0.5;
                  dVar88 = ABS(dVar95);
                  dVar94 = ABS(dVar94);
                  if (ABS(dVar85) <= dVar94) {
                    dVar94 = ABS(dVar85);
                  }
                  if (dVar88 <= dVar94) {
                    dVar94 = dVar88;
                  }
                  dVar95 = dVar94 * (double)((ulong)dVar95 & 0x8000000000000000 | uVar53);
                }
                if (1.0000000000000001e-20 < dVar91 * dVar85) {
                  dVar85 = (dVar97 - dVar83) * 0.5;
                  dVar91 = ABS(dVar85);
                  if (dVar89 <= dVar84) {
                    dVar84 = dVar89;
                  }
                  if (dVar91 <= dVar84) {
                    dVar84 = dVar91;
                  }
                  dVar92 = dVar84 * (double)((ulong)dVar85 & 0x8000000000000000 | uVar53);
                }
                dVar89 = (dVar86 + dVar83) * 0.5 + (dVar90 - dVar93) * -0.16666666666666666;
                dVar84 = dVar83;
                if (dVar86 <= dVar83) {
                  dVar84 = dVar86;
                }
                if (dVar84 <= dVar89) {
                  dVar84 = dVar89;
                }
                uVar80 = (undefined4)((ulong)dVar83 >> 0x20);
                uVar79 = SUB84(dVar86,0);
                uVar82 = (undefined4)((ulong)dVar86 >> 0x20);
                uVar78 = SUB84(dVar83,0);
                uVar81 = uVar80;
                if (dVar83 <= dVar86) {
                  uVar78 = uVar79;
                  uVar81 = uVar82;
                }
                if (dVar84 <= (double)CONCAT44(uVar81,uVar78)) {
                  uVar78 = SUB84(dVar84,0);
                  uVar81 = (undefined4)((ulong)dVar84 >> 0x20);
                }
                dVar89 = (dVar86 + dVar97) * 0.5 + (dVar95 - dVar92) * -0.16666666666666666;
                dVar84 = dVar97;
                if (dVar86 <= dVar97) {
                  dVar84 = dVar86;
                }
                if (dVar84 <= dVar89) {
                  dVar84 = dVar89;
                }
                dVar89 = dVar97;
                if (dVar97 <= dVar86) {
                  dVar89 = dVar86;
                }
                if (dVar84 <= dVar89) {
                  dVar89 = dVar84;
                }
                dVar93 = dVar89 - dVar86;
                dVar90 = dVar86;
                dVar84 = dVar86;
                if (0.0 <= (dVar86 - (double)CONCAT44(uVar81,uVar78)) * dVar93) {
                  dVar85 = ABS(dVar93);
                  dVar91 = ABS((double)CONCAT44(uVar81,uVar78) - dVar86);
                  if (dVar91 + dVar91 <= dVar85) {
                    dVar90 = dVar86 * 3.0 -
                             ((double)CONCAT44(uVar81,uVar78) + (double)CONCAT44(uVar81,uVar78));
                    dVar84 = (double)CONCAT44(uVar81,uVar78);
                  }
                  else {
                    dVar84 = (double)CONCAT44(uVar81,uVar78);
                    dVar90 = dVar89;
                    if (dVar85 + dVar85 <= dVar91) {
                      dVar84 = dVar86 * 3.0 - (dVar89 + dVar89);
                    }
                  }
                }
                if (pBVar1->bc[1] - 3U < 2) {
                  if (lVar71 == geom.domain.smallend.vect[1]) {
                    dVar84 = dVar96 * -0.05 + dVar97 * 0.5 + dVar83 * -0.2 + dVar86 * 0.75;
                    dVar96 = dVar86;
                    if (dVar97 <= dVar86) {
                      dVar96 = dVar97;
                    }
                    if (dVar96 <= dVar84) {
                      dVar96 = dVar84;
                    }
                    dVar90 = dVar86;
                    if (dVar86 <= dVar97) {
                      dVar90 = dVar97;
                    }
                    dVar84 = dVar83;
                    if (dVar96 <= dVar90) {
                      dVar90 = dVar96;
                    }
                  }
                  else if (lVar71 == (long)geom.domain.smallend.vect[1] + 1) {
                    dVar96 = *(double *)((long)local_428 + lVar68 * 8 + lVar74);
                    dVar90 = *(double *)((long)local_420 + lVar68 * 8 + lVar74) * -0.05 +
                             dVar86 * 0.5 +
                             *(double *)((long)local_430 + lVar68 * 8 + lVar74) * -0.2 +
                             dVar96 * 0.75;
                    dVar84 = dVar96;
                    if (dVar86 <= dVar96) {
                      dVar84 = dVar86;
                    }
                    if (dVar84 <= dVar90) {
                      dVar84 = dVar90;
                    }
                    uVar78 = SUB84(dVar96,0);
                    uVar81 = (int)((ulong)dVar96 >> 0x20);
                    if (dVar96 <= dVar86) {
                      uVar78 = uVar79;
                      uVar81 = uVar82;
                    }
                    if (dVar84 <= (double)CONCAT44(uVar81,uVar78)) {
                      uVar78 = SUB84(dVar84,0);
                      uVar81 = (undefined4)((ulong)dVar84 >> 0x20);
                    }
                    dVar90 = dVar86;
                    dVar84 = dVar86;
                    if (0.0 < (dVar86 - (double)CONCAT44(uVar81,uVar78)) * dVar93) {
                      dVar93 = ABS(dVar93);
                      dVar96 = ABS((double)CONCAT44(uVar81,uVar78) - dVar86);
                      if (dVar96 + dVar96 <= dVar93) {
                        dVar90 = dVar86 * 3.0 -
                                 ((double)CONCAT44(uVar81,uVar78) + (double)CONCAT44(uVar81,uVar78))
                        ;
                        dVar84 = (double)CONCAT44(uVar81,uVar78);
                      }
                      else if (dVar93 + dVar93 <= dVar96) {
                        dVar90 = dVar89;
                        dVar84 = dVar86 * 3.0 - (dVar89 + dVar89);
                      }
                      else {
                        dVar90 = dVar89;
                        dVar84 = (double)CONCAT44(uVar81,uVar78);
                      }
                    }
                  }
                }
                if (pBVar1->bc[4] - 3U < 2) {
                  if (lVar71 == geom.domain.bigend.vect[1]) {
                    dVar87 = dVar87 * -0.05 + dVar83 * 0.5 + dVar97 * -0.2 + dVar86 * 0.75;
                    if (dVar83 <= dVar86) {
                      uVar79 = SUB84(dVar83,0);
                      uVar82 = uVar80;
                    }
                    dVar96 = (double)CONCAT44(uVar82,uVar79);
                    if ((double)CONCAT44(uVar82,uVar79) <= dVar87) {
                      dVar96 = dVar87;
                    }
                    dVar84 = dVar86;
                    if (dVar86 <= dVar83) {
                      dVar84 = dVar83;
                    }
                    dVar90 = dVar97;
                    if (dVar96 <= dVar84) {
                      dVar84 = dVar96;
                    }
                  }
                  else if (lVar71 == (long)geom.domain.bigend.vect[1] + -1) {
                    dVar87 = *(double *)((long)local_440 + lVar68 * 8 + lVar74);
                    dVar97 = *(double *)((long)local_438 + lVar68 * 8 + lVar74) * -0.05 +
                             dVar86 * 0.5 +
                             *(double *)((long)local_448 + lVar68 * 8 + lVar74) * -0.2 +
                             dVar87 * 0.75;
                    dVar83 = dVar87;
                    if (dVar86 <= dVar87) {
                      dVar83 = dVar86;
                    }
                    if (dVar83 <= dVar97) {
                      dVar83 = dVar97;
                    }
                    if (dVar87 <= dVar86) {
                      dVar87 = dVar86;
                    }
                    if (dVar83 <= dVar87) {
                      dVar87 = dVar83;
                    }
                    dVar90 = dVar86;
                    dVar84 = dVar86;
                    if (0.0 < (dVar86 - (double)CONCAT44(uVar81,uVar78)) * (dVar87 - dVar86)) {
                      dVar97 = ABS(dVar87 - dVar86);
                      dVar83 = ABS((double)CONCAT44(uVar81,uVar78) - dVar86);
                      if (dVar83 + dVar83 <= dVar97) {
                        dVar90 = dVar86 * 3.0 -
                                 ((double)CONCAT44(uVar81,uVar78) + (double)CONCAT44(uVar81,uVar78))
                        ;
                        dVar84 = (double)CONCAT44(uVar81,uVar78);
                      }
                      else {
                        dVar90 = dVar87;
                        if (dVar97 + dVar97 <= dVar83) {
                          dVar84 = dVar86 * 3.0 - (dVar87 + dVar87);
                        }
                        else {
                          dVar84 = (double)CONCAT44(uVar81,uVar78);
                        }
                      }
                    }
                  }
                }
                dVar83 = dVar86 * 6.0 + (dVar84 + dVar90) * -3.0;
                dVar87 = ABS(dVar3) * (dt / geom.super_CoordSys.dx[1]);
                if (dVar3 <= 1e-08) {
                  *(double *)((long)local_488 + lVar68 * 8 + lVar57) = dVar86;
                  if (-1e-08 <= dVar3) goto LAB_003a0087;
                  *(double *)((long)local_480 + lVar68 * 8 + lVar56) =
                       ((dVar87 * -0.6666666666666666 + 1.0) * dVar83 + (dVar90 - dVar84)) *
                       dVar87 * 0.5 + dVar84;
                  dVar86 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                }
                else {
                  *(double *)((long)local_488 + lVar68 * 8 + lVar57) =
                       dVar87 * -0.5 *
                       ((dVar90 - dVar84) - (dVar87 * -0.6666666666666666 + 1.0) * dVar83) + dVar90;
LAB_003a0087:
                  dVar86 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                  *(double *)((long)local_480 + lVar68 * 8 + lVar56) = dVar86;
                }
                dVar3 = *(double *)
                         ((long)pdVar30 +
                         lVar68 * 8 + lVar69 + lVar75 + lVar29 * 0x10 + lVar73 * 8 + lVar66 * -8);
                dVar87 = *(double *)((long)local_450 + lVar68 * 8 + lVar77 + (iVar62 + -2) * lVar76)
                ;
                dVar83 = *(double *)
                          ((long)local_450 + lVar68 * 8 + lVar77 + (int)(~uVar7 + iVar61) * lVar76);
                dVar97 = *(double *)
                          ((long)local_450 +
                          lVar68 * 8 + lVar77 + (int)((iVar61 + 1) - uVar7) * lVar76);
                dVar96 = *(double *)((long)local_450 + lVar68 * 8 + lVar77 + (iVar62 + 2) * lVar76);
                dVar85 = (dVar97 - dVar86) + (dVar97 - dVar86);
                dVar91 = (dVar86 - dVar83) + (dVar86 - dVar83);
                dVar90 = 0.0;
                dVar84 = ABS(dVar85);
                dVar93 = ABS(dVar91);
                dVar89 = 0.0;
                uVar53 = (ulong)DAT_00753000;
                if (1.0000000000000001e-20 < dVar91 * dVar85) {
                  dVar92 = (dVar97 - dVar83) * 0.5;
                  dVar94 = ABS(dVar92);
                  dVar89 = dVar84;
                  if (dVar93 <= dVar84) {
                    dVar89 = dVar93;
                  }
                  if (dVar94 <= dVar89) {
                    dVar89 = dVar94;
                  }
                  dVar89 = dVar89 * (double)((ulong)dVar92 & 0x8000000000000000 | uVar53);
                }
                dVar92 = (dVar83 - dVar87) + (dVar83 - dVar87);
                if (1.0000000000000001e-20 < dVar92 * dVar91) {
                  dVar94 = (dVar86 - dVar87) * 0.5;
                  dVar95 = ABS(dVar94);
                  dVar92 = ABS(dVar92);
                  dVar90 = ABS(dVar91);
                  if (dVar92 <= ABS(dVar91)) {
                    dVar90 = dVar92;
                  }
                  if (dVar95 <= dVar90) {
                    dVar90 = dVar95;
                  }
                  dVar90 = dVar90 * (double)((ulong)dVar94 & 0x8000000000000000 | uVar53);
                }
                dVar92 = (dVar96 - dVar97) + (dVar96 - dVar97);
                dVar94 = 0.0;
                dVar95 = 0.0;
                if (1.0000000000000001e-20 < dVar85 * dVar92) {
                  dVar95 = (dVar96 - dVar86) * 0.5;
                  dVar88 = ABS(dVar95);
                  dVar92 = ABS(dVar92);
                  if (ABS(dVar85) <= dVar92) {
                    dVar92 = ABS(dVar85);
                  }
                  if (dVar88 <= dVar92) {
                    dVar92 = dVar88;
                  }
                  dVar95 = dVar92 * (double)((ulong)dVar95 & 0x8000000000000000 | uVar53);
                }
                if (1.0000000000000001e-20 < dVar91 * dVar85) {
                  dVar85 = (dVar97 - dVar83) * 0.5;
                  dVar91 = ABS(dVar85);
                  if (dVar93 <= dVar84) {
                    dVar84 = dVar93;
                  }
                  if (dVar91 <= dVar84) {
                    dVar84 = dVar91;
                  }
                  dVar94 = dVar84 * (double)((ulong)dVar85 & 0x8000000000000000 | uVar53);
                }
                dVar89 = (dVar86 + dVar83) * 0.5 + (dVar89 - dVar90) * -0.16666666666666666;
                dVar84 = dVar83;
                if (dVar86 <= dVar83) {
                  dVar84 = dVar86;
                }
                if (dVar84 <= dVar89) {
                  dVar84 = dVar89;
                }
                dVar89 = dVar83;
                if (dVar83 <= dVar86) {
                  dVar89 = dVar86;
                }
                if (dVar84 <= dVar89) {
                  dVar89 = dVar84;
                }
                dVar90 = (dVar86 + dVar97) * 0.5 + (dVar95 - dVar94) * -0.16666666666666666;
                dVar84 = dVar97;
                if (dVar86 <= dVar97) {
                  dVar84 = dVar86;
                }
                if (dVar84 <= dVar90) {
                  dVar84 = dVar90;
                }
                dVar90 = dVar97;
                if (dVar97 <= dVar86) {
                  dVar90 = dVar86;
                }
                if (dVar84 <= dVar90) {
                  dVar90 = dVar84;
                }
                dVar85 = dVar90 - dVar86;
                dVar93 = dVar86;
                dVar84 = dVar86;
                if (0.0 <= (dVar86 - dVar89) * dVar85) {
                  dVar91 = ABS(dVar85);
                  dVar92 = ABS(dVar89 - dVar86);
                  dVar84 = dVar89;
                  if (dVar92 + dVar92 <= dVar91) {
                    dVar93 = dVar86 * 3.0 - (dVar89 + dVar89);
                  }
                  else {
                    dVar93 = dVar90;
                    if (dVar91 + dVar91 <= dVar92) {
                      dVar84 = dVar86 * 3.0 - (dVar90 + dVar90);
                    }
                  }
                }
                if (pBVar1->bc[2] - 3U < 2) {
                  if (geom.domain.smallend.vect[2] == iVar61) {
                    dVar84 = dVar96 * -0.05 + dVar97 * 0.5 + dVar83 * -0.2 + dVar86 * 0.75;
                    dVar96 = dVar86;
                    if (dVar97 <= dVar86) {
                      dVar96 = dVar97;
                    }
                    if (dVar96 <= dVar84) {
                      dVar96 = dVar84;
                    }
                    dVar93 = dVar86;
                    if (dVar86 <= dVar97) {
                      dVar93 = dVar97;
                    }
                    dVar84 = dVar83;
                    if (dVar96 <= dVar93) {
                      dVar93 = dVar96;
                    }
                  }
                  else if (geom.domain.smallend.vect[2] + 1 == iVar61) {
                    dVar89 = *(double *)((long)local_3f0 + lVar68 * 8 + lVar77);
                    dVar84 = *(double *)((long)local_3e8 + lVar68 * 8 + lVar77) * -0.05 +
                             dVar86 * 0.5 +
                             *(double *)((long)local_3f8 + lVar68 * 8 + lVar77) * -0.2 +
                             dVar89 * 0.75;
                    dVar96 = dVar89;
                    if (dVar86 <= dVar89) {
                      dVar96 = dVar86;
                    }
                    if (dVar96 <= dVar84) {
                      dVar96 = dVar84;
                    }
                    if (dVar89 <= dVar86) {
                      dVar89 = dVar86;
                    }
                    if (dVar96 <= dVar89) {
                      dVar89 = dVar96;
                    }
                    dVar93 = dVar86;
                    dVar84 = dVar86;
                    if (0.0 < (dVar86 - dVar89) * dVar85) {
                      dVar85 = ABS(dVar85);
                      dVar96 = ABS(dVar89 - dVar86);
                      dVar84 = dVar89;
                      if (dVar96 + dVar96 <= dVar85) {
                        dVar93 = dVar86 * 3.0 - (dVar89 + dVar89);
                      }
                      else {
                        dVar93 = dVar90;
                        if (dVar85 + dVar85 <= dVar96) {
                          dVar84 = dVar86 * 3.0 - (dVar90 + dVar90);
                        }
                      }
                    }
                  }
                }
                if (pBVar1->bc[5] - 3U < 2) {
                  if (geom.domain.bigend.vect[2] == iVar61) {
                    dVar96 = dVar87 * -0.05 + dVar83 * 0.5 + dVar97 * -0.2 + dVar86 * 0.75;
                    dVar87 = dVar86;
                    if (dVar83 <= dVar86) {
                      dVar87 = dVar83;
                    }
                    if (dVar87 <= dVar96) {
                      dVar87 = dVar96;
                    }
                    dVar84 = dVar86;
                    if (dVar86 <= dVar83) {
                      dVar84 = dVar83;
                    }
                    dVar93 = dVar97;
                    if (dVar87 <= dVar84) {
                      dVar84 = dVar87;
                    }
                  }
                  else if (geom.domain.bigend.vect[2] + -1 == iVar61) {
                    dVar87 = *(double *)((long)local_408 + lVar68 * 8 + lVar77);
                    uVar78 = SUB84(dVar87,0);
                    uVar79 = (undefined4)((ulong)dVar87 >> 0x20);
                    dVar97 = *(double *)((long)local_400 + lVar68 * 8 + lVar77) * -0.05 +
                             dVar86 * 0.5 +
                             *(double *)((long)local_410 + lVar68 * 8 + lVar77) * -0.2 +
                             dVar87 * 0.75;
                    dVar83 = dVar87;
                    if (dVar86 <= dVar87) {
                      dVar83 = dVar86;
                    }
                    if (dVar83 <= dVar97) {
                      dVar83 = dVar97;
                    }
                    if (dVar87 <= dVar86) {
                      uVar78 = SUB84(dVar86,0);
                      uVar79 = (undefined4)((ulong)dVar86 >> 0x20);
                    }
                    if (dVar83 <= (double)CONCAT44(uVar79,uVar78)) {
                      uVar78 = SUB84(dVar83,0);
                      uVar79 = (undefined4)((ulong)dVar83 >> 0x20);
                    }
                    dVar87 = (double)CONCAT44(uVar79,uVar78) - dVar86;
                    dVar93 = dVar86;
                    dVar84 = dVar86;
                    if (0.0 < (dVar86 - dVar89) * dVar87) {
                      dVar87 = ABS(dVar87);
                      dVar83 = ABS(dVar89 - dVar86);
                      if (dVar83 + dVar83 <= dVar87) {
                        dVar93 = dVar86 * 3.0 - (dVar89 + dVar89);
                        dVar84 = dVar89;
                      }
                      else {
                        if (dVar87 + dVar87 <= dVar83) {
                          dVar89 = dVar86 * 3.0 -
                                   ((double)CONCAT44(uVar79,uVar78) +
                                   (double)CONCAT44(uVar79,uVar78));
                        }
                        dVar93 = (double)CONCAT44(uVar79,uVar78);
                        dVar84 = dVar89;
                      }
                    }
                  }
                }
                dVar83 = dVar86 * 6.0 + (dVar84 + dVar93) * -3.0;
                dVar87 = ABS(dVar3) * (dt / geom.super_CoordSys.dx[2]);
                if (dVar3 <= 1e-08) {
                  *(double *)((long)local_490 + lVar68 * 8 + lVar58) = dVar86;
                  if (-1e-08 <= dVar3) goto LAB_003a0978;
                  dVar84 = ((dVar87 * -0.6666666666666666 + 1.0) * dVar83 + (dVar93 - dVar84)) *
                           dVar87 * 0.5 + dVar84;
                }
                else {
                  *(double *)((long)local_490 + lVar68 * 8 + lVar58) =
                       dVar87 * -0.5 *
                       ((dVar93 - dVar84) - (dVar87 * -0.6666666666666666 + 1.0) * dVar83) + dVar93;
LAB_003a0978:
                  dVar84 = *(double *)((long)local_450 + lVar68 * 8 + lVar59);
                }
                *(double *)
                 ((long)local_498 +
                 lVar68 * 8 + (lVar71 - iVar18) * lVar47 * 8 + (long)(iVar61 - iVar19) * lVar48 * 8)
                     = dVar84;
                lVar68 = lVar68 + 1;
              } while ((iVar24 - iVar4) + 1 != (int)lVar68);
            }
            lVar71 = lVar71 + 1;
          } while (iVar70 + 1 != iVar25 + 1);
        }
        iVar61 = iVar61 + 1;
      } while (iVar61 != iVar26 + 1);
    }
    local_458 = local_458 + 1;
    local_470 = local_470 + lVar37;
    local_478 = local_478 + lVar40;
    local_480 = local_480 + lVar43;
    local_488 = local_488 + lVar46;
    local_490 = local_490 + lVar52;
    local_498 = local_498 + lVar49;
    local_420 = local_420 + lVar34;
    local_428 = local_428 + lVar34;
    local_430 = local_430 + lVar34;
    local_438 = local_438 + lVar34;
    local_440 = local_440 + lVar34;
    local_448 = local_448 + lVar34;
    local_450 = local_450 + lVar34;
    local_3e8 = local_3e8 + lVar34;
    local_3f0 = local_3f0 + lVar34;
    local_3f8 = local_3f8 + lVar34;
    local_400 = local_400 + lVar34;
    local_408 = local_408 + lVar34;
    local_410 = local_410 + lVar34;
    if (local_458 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
PPM::PredictVelOnFaces (Box const& bx,
                        AMREX_D_DECL( Array4<Real> const& Imx,
                                      Array4<Real> const& Imy,
                                      Array4<Real> const& Imz),
                        AMREX_D_DECL( Array4<Real> const& Ipx,
                                      Array4<Real> const& Ipy,
                                      Array4<Real> const& Ipz),
                        Array4<Real const> const& q,
                        Array4<Real const> const& vel,
                        Geometry geom,
                        Real dt,
                        BCRec const* pbc)
{
    const Box& domain = geom.Domain();
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    const auto dx = geom.CellSizeArray();
    AMREX_D_TERM( Real l_dtdx = dt / dx[0];,
                  Real l_dtdy = dt / dx[1];,
                  Real l_dtdz = dt / dx[2];);

    amrex::ParallelFor(bx, AMREX_SPACEDIM,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        PredictVelOnXFace(i,j,k,n,l_dtdx,vel(i,j,k,0),q,Imx,Ipx,pbc[n],dlo.x,dhi.x);
        PredictVelOnYFace(i,j,k,n,l_dtdy,vel(i,j,k,1),q,Imy,Ipy,pbc[n],dlo.y,dhi.y);
#if (AMREX_SPACEDIM==3)
        PredictVelOnZFace(i,j,k,n,l_dtdz,vel(i,j,k,2),q,Imz,Ipz,pbc[n],dlo.z,dhi.z);
#endif
    });
}